

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O2

int CheckForCloseCubes(Cube *p,int fAddCube)

{
  short sVar1;
  int iVar2;
  Cube **ppCVar3;
  long lVar4;
  cubedist Dist;
  Cube *pCVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  
  bVar8 = fAddCube == 0;
  iVar7 = 0;
LAB_002f35e3:
  s_Que[0].PosCur = s_Que[0].PosIn;
  s_Que[1].PosCur = s_Que[1].PosIn;
  s_Que[2].PosCur = s_Que[2].PosIn;
  ppCVar3 = &s_List;
  do {
    s_q = *ppCVar3;
    if (s_q == (Cube *)0x0) {
      if (!bVar8) {
        CubeInsert(p);
      }
      iVar2 = 0;
LAB_002f37de:
      s_Que[0].PosIn = s_Que[0].PosCur;
      s_Que[1].PosIn = s_Que[1].PosCur;
      s_Que[2].PosIn = s_Que[2].PosCur;
      return iVar2 + iVar7;
    }
    s_Distance = GetDistancePlus(p,s_q);
    if (s_Distance < 5) {
      switch(s_Distance) {
      case 1:
        goto switchD_002f3642_caseD_1;
      case 2:
        Dist = DIST2;
        if (s_fDistEnable2 == 0) goto LAB_002f366c;
        goto LAB_002f365d;
      case 3:
        Dist = DIST3;
        iVar2 = s_fDistEnable3;
        break;
      case 4:
        Dist = DIST4;
        iVar2 = s_fDistEnable4;
        break;
      default:
        AddToFreeCubes(p);
        pCVar5 = s_q;
        CubeExtract(s_q);
        AddToFreeCubes(pCVar5);
        s_Que[0].PosCur = s_Que[0].PosIn;
        s_Que[1].PosCur = s_Que[1].PosIn;
        s_Que[2].PosCur = s_Que[2].PosIn;
        iVar2 = 2;
        goto LAB_002f37de;
      }
      if (iVar2 != 0) {
LAB_002f365d:
        NewRangeInsertCubePair(Dist,p,s_q);
      }
    }
LAB_002f366c:
    ppCVar3 = &s_q->Next;
  } while( true );
switchD_002f3642_caseD_1:
  s_ChangeStore_0 = (uint)(s_DiffVarNum != -1);
  s_ChangeStore_2 = (int)s_q->a;
  _s_ChangeStore_3 = (int)p->a;
  s_ChangeStore_4 = (int)s_q->q;
  _s_ChangeStore_5 = (int)p->q;
  _s_ChangeStore_6 = (int)p->z;
  s_ChangeStore_7 = s_DiffVarNum;
  s_ChangeStore_8 = s_DiffVarValueQ;
  _s_ChangeStore_9 = (uint)s_q->ID;
  s_ChangeStore_1 = p;
  CubeExtract(s_q);
  if (s_DiffVarNum == -1) {
    p->z = 0;
    pCVar5 = s_q;
    sVar1 = 0;
    for (lVar4 = 0; lVar4 < g_CoverInfo.nWordsOut; lVar4 = lVar4 + 1) {
      uVar6 = p->pCubeDataOut[lVar4] ^ pCVar5->pCubeDataOut[lVar4];
      p->pCubeDataOut[lVar4] = uVar6;
      sVar1 = sVar1 + (ushort)BitCount[uVar6 >> 0x10] + (ushort)BitCount[uVar6 & 0xffff];
      p->z = sVar1;
    }
  }
  else {
    if (s_DiffVarValueP_old - 1U < 2) {
      p->a = p->a + -1;
    }
    if (s_DiffVarValueP_new - 1U < 2) {
      p->a = p->a + 1;
    }
    iVar2 = ComputeQCostBits(p);
    p->q = (short)iVar2;
    pCVar5 = s_q;
  }
  AddToFreeCubes(pCVar5);
  iVar7 = iVar7 + 1;
  bVar8 = false;
  goto LAB_002f35e3;
}

Assistant:

int CheckForCloseCubes( Cube* p, int fAddCube )
// checks the cube storage for a cube that is dist-0 and dist-1 removed 
// from the given one (p) if such a cube is found, extracts it from the data 
// structure, EXORs it with the given cube, adds the resultant cube
// to the data structure and performed the same check for the resultant cube;
// returns the number of cubes gained in the process of reduction;
// if an adjacent cube is not found, inserts the cube only if (fAddCube==1)!!!
{
    // start the new range
    NewRangeReset();

    for ( s_q = s_List; s_q; s_q = s_q->Next )
    {
        s_Distance = GetDistancePlus( p, s_q );
        if ( s_Distance > 4 )
        {
        }
        else if ( s_Distance == 4 )
        {
            if ( s_fDistEnable4 ) 
                NewRangeInsertCubePair( DIST4, p, s_q );
        }
        else if ( s_Distance == 3 )
        {
            if ( s_fDistEnable3 ) 
                NewRangeInsertCubePair( DIST3, p, s_q );
        }
        else if ( s_Distance == 2 )
        { 
            if ( s_fDistEnable2 ) 
                NewRangeInsertCubePair( DIST2, p, s_q );
        }
        else if ( s_Distance == 1 )
        {   // extract the cube from the data structure

            //////////////////////////////////////////////////////////
            // store the changes
            s_ChangeStore.fInput = (s_DiffVarNum != -1);
            s_ChangeStore.p      = p;
            s_ChangeStore.PrevQa = s_q->a;
            s_ChangeStore.PrevPa = p->a;
            s_ChangeStore.PrevQq = s_q->q;
            s_ChangeStore.PrevPq = p->q;
            s_ChangeStore.PrevPz = p->z;
            s_ChangeStore.Var    = s_DiffVarNum;
            s_ChangeStore.Value  = s_DiffVarValueQ;
            s_ChangeStore.PrevID = s_q->ID;
            //////////////////////////////////////////////////////////

            CubeExtract( s_q );
            // perform the EXOR of the two cubes and write the result into p

            // it is important that the resultant cube is written into p!!!

            if ( s_DiffVarNum == -1 )
            {
                int i;
                // exor the output part
                p->z = 0;
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    p->pCubeDataOut[i] ^= s_q->pCubeDataOut[i];
                    p->z += BIT_COUNT(p->pCubeDataOut[i]);
                }
            }
            else
            {
                // the cube has already been updated by GetDistancePlus()

                // modify the parameters of the number of literals in the new cube
//              p->a += s_UpdateLiterals[ s_DiffVarValueP ][ s_DiffVarValueQ ];
                if ( s_DiffVarValueP_old == VAR_NEG || s_DiffVarValueP_old == VAR_POS )
                    p->a--;
                if ( s_DiffVarValueP_new == VAR_NEG || s_DiffVarValueP_new == VAR_POS )
                    p->a++;
                p->q = ComputeQCostBits(p);
            }

            // move q to the free cube list
            AddToFreeCubes( s_q );

            // make sure that nobody with use the pairs created so far
//          NewRangeReset();
            // call the function again for the new cube
            return 1 + CheckForCloseCubes( p, 1 );
        }
        else // if ( Distance == 0 )
        {   // extract the second cube from the data structure and add them both to the free list
            AddToFreeCubes( p );
            AddToFreeCubes( CubeExtract( s_q ) );

            // make sure that nobody with use the pairs created so far
            NewRangeReset();
            return 2;
        }
    }
    
    // add the cube to the data structure if needed
    if ( fAddCube )
        CubeInsert( p );

    // add temporarily stored new range of cube pairs to the queque
    NewRangeAdd();

    return 0;
}